

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_server.cpp
# Opt level: O0

void __thiscall cppcms::impl::tcp_cache_service::session::handle_error(session *this,error_code *e)

{
  bool bVar1;
  level_type lVar2;
  int iVar3;
  error_category *this_00;
  ulong uVar4;
  ostream *poVar5;
  error_code *this_01;
  error_code *in_RSI;
  error_code *in_stack_fffffffffffffec8;
  string local_d8 [39];
  byte local_b1;
  message local_b0 [55];
  byte local_79;
  string local_78 [55];
  byte local_41;
  message local_40 [48];
  error_code *local_10;
  
  local_10 = in_RSI;
  this_00 = std::error_code::category(in_RSI);
  bVar1 = std::_V2::error_category::operator==(this_00,booster::aio::aio_error_cat);
  if ((bVar1) && (iVar3 = std::error_code::value(local_10), iVar3 == 3)) {
    lVar2 = booster::log::logger::instance();
    uVar4 = booster::log::logger::should_be_logged(lVar2,(char *)0x46);
    local_41 = 0;
    local_79 = 0;
    if ((uVar4 & 1) != 0) {
      booster::log::message::message
                (local_40,debug,"cppcms_scale",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/src/tcp_cache_server.cpp"
                 ,0xeb);
      local_41 = 1;
      poVar5 = (ostream *)booster::log::message::out();
      poVar5 = std::operator<<(poVar5,"Client disconnected, fd=");
      iVar3 = booster::aio::basic_io_device::native();
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
      poVar5 = std::operator<<(poVar5,"; ");
      std::error_code::message_abi_cxx11_(in_stack_fffffffffffffec8);
      local_79 = 1;
      poVar5 = std::operator<<(poVar5,local_78);
      std::ios::operator_cast_to_bool(poVar5 + *(long *)(*(long *)poVar5 + -0x18));
    }
    if ((local_79 & 1) != 0) {
      std::__cxx11::string::~string(local_78);
    }
    if ((local_41 & 1) != 0) {
      booster::log::message::~message(local_40);
    }
  }
  else {
    lVar2 = booster::log::logger::instance();
    uVar4 = booster::log::logger::should_be_logged(lVar2,(char *)0x28);
    local_b1 = 0;
    if ((uVar4 & 1) != 0) {
      booster::log::message::message
                (local_b0,warning,"cppcms_scale",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/src/tcp_cache_server.cpp"
                 ,0xef);
      local_b1 = 1;
      poVar5 = (ostream *)booster::log::message::out();
      this_01 = (error_code *)std::operator<<(poVar5,"Error on connection, fd=");
      iVar3 = booster::aio::basic_io_device::native();
      poVar5 = (ostream *)std::ostream::operator<<(this_01,iVar3);
      poVar5 = std::operator<<(poVar5,"; ");
      std::error_code::message_abi_cxx11_(this_01);
      poVar5 = std::operator<<(poVar5,local_d8);
      std::ios::operator_cast_to_bool(poVar5 + *(long *)(*(long *)poVar5 + -0x18));
      std::__cxx11::string::~string(local_d8);
    }
    if ((local_b1 & 1) != 0) {
      booster::log::message::~message(local_b0);
    }
  }
  return;
}

Assistant:

void handle_error(booster::system::error_code const &e)
	{
		if(e.category() == booster::aio::aio_error_cat && e.value() == booster::aio::aio_error::eof) {
			BOOSTER_DEBUG("cppcms_scale") << "Client disconnected, fd=" << socket_.native() 
				<<"; " << e.message();
			return;
		}
		BOOSTER_WARNING("cppcms_scale") << "Error on connection, fd=" << socket_.native() 
				<<"; " << e.message();
	}